

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

double expected_separation_depth<double>(double n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (n < 87670.0) {
    dVar1 = floor(n);
    dVar2 = expected_separation_depth
                      ((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1);
    dVar3 = ceil(n);
    return (n - dVar1) * (((dVar3 * 3.0 - dVar2 * dVar3) + -4.0) / ((dVar3 + -1.0) * dVar3) + dVar2)
           + dVar2;
  }
  return 3.0;
}

Assistant:

double expected_separation_depth(ldouble_safe n)
{
    if (n >= THRESHOLD_EXACT_S)
        return 3;
    double s_l = expected_separation_depth((size_t) std::floor(n));
    ldouble_safe u = std::ceil(n);
    double s_u = s_l + (-s_l * u + 3. * u - 4.) / (u * (u - 1.));
    double diff = n - std::floor(n);
    return s_l + diff * s_u;
}